

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,BuildKey *Elt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  BuildKey *Elt_local;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    grow(this,0);
  }
  pvVar1 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)((long)pvVar1 + sVar2 * 0x20),Elt);
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }